

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::closeEvent(QWidgetWindow *this,QCloseEvent *event)

{
  long lVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  
  lVar1 = *(long *)&this->field_0x8;
  bVar2 = ::operator==(&qt_popup_down,&this->m_widget);
  if (bVar2) {
    qt_popup_down = (QWidget *)0x0;
    qt_popup_down_closed = true;
  }
  bVar2 = QWidgetPrivate::handleClose
                    (*(QWidgetPrivate **)((this->m_widget).wp.value + 8),
                     CloseWithSpontaneousEvent - *(byte *)(lVar1 + 0x93));
  (**(code **)(*(long *)event + 0x10))(event,bVar2,extraout_RDX,*(code **)(*(long *)event + 0x10));
  return;
}

Assistant:

void QWidgetWindow::closeEvent(QCloseEvent *event)
{
    Q_D(QWidgetWindow);
    if (qt_popup_down == m_widget) {
        qt_popup_down = nullptr;
        qt_popup_down_closed = true;
    }
    bool accepted = m_widget->d_func()->handleClose(d->inClose ? QWidgetPrivate::CloseWithEvent
                                                                  : QWidgetPrivate::CloseWithSpontaneousEvent);
    event->setAccepted(accepted);
}